

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcLoadModuleByBinary(char *module,char *binary)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nullres nVar4;
  char *pcVar5;
  TraceScope traceScope;
  char path [1024];
  TraceScope TStack_428;
  char local_418 [1024];
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcLoadModuleByBinary::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&nullcLoadModuleByBinary::token), iVar1 != 0)) {
    nullcLoadModuleByBinary::token = NULLC::TraceGetToken("nullc","nullcLoadModuleByBinary");
    __cxa_guard_release(&nullcLoadModuleByBinary::token);
  }
  NULLC::TraceScope::TraceScope(&TStack_428,nullcLoadModuleByBinary::token);
  NULLC::TraceLabel(module);
  sVar2 = strlen(module);
  if (sVar2 < 0x201) {
    strcpy(local_418,module);
    pcVar3 = local_418;
    while (pcVar5 = pcVar3, *pcVar5 != '\0') {
      pcVar3 = pcVar5 + 1;
      if (*pcVar5 == '.') {
        *pcVar5 = '/';
      }
    }
    sVar2 = strlen(local_418);
    builtin_strncpy(local_418 + sVar2,".nc",4);
    pcVar3 = BinaryCache::GetBytecode(local_418);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)(*(code *)NULLC::alloc)(*(undefined4 *)binary);
      memcpy(pcVar3,binary,(ulong)*(uint *)binary);
      nVar4 = '\x01';
      BinaryCache::PutBytecode(local_418,pcVar3,(Lexeme *)0x0,0);
      goto LAB_0010bd53;
    }
    NULLC::nullcLastError = "ERROR: module already loaded";
  }
  else {
    NULLC::nullcLastError = "ERROR: module name is too long";
  }
  nVar4 = '\0';
LAB_0010bd53:
  NULLC::TraceScope::~TraceScope(&TStack_428);
  return nVar4;
}

Assistant:

nullres nullcLoadModuleByBinary(const char* module, const char* binary)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLoadModuleByBinary");
	TRACE_LABEL(module);

	if(strlen(module) > 512)
	{
		nullcLastError = "ERROR: module name is too long";
		return false;
	}

	char	path[1024];
	strcpy(path, module);
	char	*pos = path;
	while(*pos)
		if(*pos++ == '.')
			pos[-1] = '/';
	strcat(path, ".nc");

	if(BinaryCache::GetBytecode(path))
	{
		nullcLastError = "ERROR: module already loaded";
		return false;
	}
	// Duplicate binary
	char *copy = (char*)NULLC::alloc(((ByteCode*)binary)->size);
	memcpy(copy, binary, ((ByteCode*)binary)->size);
	binary = copy;
	// Load it into cache
	BinaryCache::PutBytecode(path, binary, NULL, 0);
	return 1;
}